

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClrDirWrapper.cpp
# Opt level: O0

addr_type __thiscall
ClrDirWrapper::containsAddrType(ClrDirWrapper *this,size_t fieldId,size_t subField)

{
  IMAGE_COR20_HEADER *pIVar1;
  IMAGE_COR20_HEADER *d;
  size_t subField_local;
  size_t fieldId_local;
  ClrDirWrapper *this_local;
  
  if (fieldId != 3) {
    if (fieldId == 6) {
      pIVar1 = clrDir(this);
      if (pIVar1 == (IMAGE_COR20_HEADER *)0x0) {
        return NOT_ADDR;
      }
      if ((pIVar1->Flags & 0x10) != 0) {
        return RVA;
      }
      return NOT_ADDR;
    }
    if ((((fieldId != 7) && (fieldId != 9)) && (fieldId != 0xb)) &&
       (((fieldId != 0xd && (fieldId != 0xf)) && (fieldId != 0x11)))) {
      return NOT_ADDR;
    }
  }
  return RVA;
}

Assistant:

Executable::addr_type ClrDirWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case ENTRY_POINT: {
            const pe::IMAGE_COR20_HEADER* d = clrDir();
            if (!d) return Executable::NOT_ADDR;
            if (d->Flags & pe::COMIMAGE_FLAGS_NATIVE_ENTRYPOINT) {
                return Executable::RVA;
            } else {
                return Executable::NOT_ADDR;
            }
        }
        case RESOURCES_VA: 
        case META_DATA_VA:
        case STRONG_NAME_SIGNATURE_VA:
        case CODE_MANAGER_TABLE_VA: 
        case VTABLE_FIXUPS_VA: 
        case EXPORT_ADDR_TABLE_JMPS_VA: 
        case MANAGED_NATIVE_HDR_VA: 
            return Executable::RVA;
    }
    return Executable::NOT_ADDR;
}